

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateNoClear(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int p_col,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *p_work,int *p_idx,int num)

{
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  bool bVar17;
  fpclass_type fVar18;
  int32_t iVar19;
  type_conflict5 tVar20;
  int iVar21;
  uint uVar22;
  int *piVar23;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int32_t *piVar28;
  long lVar29;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  longlong local_130;
  multiprecision local_128 [8];
  uint auStack_120 [2];
  uint local_118 [2];
  uint auStack_110 [2];
  uint local_108 [2];
  uint auStack_100 [2];
  uint local_f8 [2];
  undefined8 uStack_f0;
  int local_e8;
  undefined1 local_e4;
  fpclass_type local_e0;
  int32_t local_dc;
  multiprecision local_d8 [8];
  uint auStack_d0 [2];
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [2];
  undefined8 uStack_a0;
  int local_98;
  undefined1 local_94;
  fpclass_type local_90;
  int32_t local_8c;
  cpp_dec_float<100U,_int,_void> local_88;
  
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x10;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems._56_5_ = 0;
  result.m_backend.data._M_elems[0xf]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  local_88.data._M_elems[0] = 1;
  local_88.data._M_elems[1] = 0;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
            (&result.m_backend,(longlong *)&local_88,&p_work[p_col].m_backend);
  local_88.data._M_elems[0xf]._1_3_ = result.m_backend.data._M_elems[0xf]._1_3_;
  local_88.data._M_elems._56_5_ = result.m_backend.data._M_elems._56_5_;
  local_88.data._M_elems[0] = result.m_backend.data._M_elems[0];
  local_88.data._M_elems[1] = result.m_backend.data._M_elems[1];
  local_88.data._M_elems[2] = result.m_backend.data._M_elems[2];
  local_88.data._M_elems[3] = result.m_backend.data._M_elems[3];
  local_88.data._M_elems[4] = result.m_backend.data._M_elems[4];
  local_88.data._M_elems[5] = result.m_backend.data._M_elems[5];
  local_88.data._M_elems[6] = result.m_backend.data._M_elems[6];
  local_88.data._M_elems[7] = result.m_backend.data._M_elems[7];
  local_88.data._M_elems[8] = result.m_backend.data._M_elems[8];
  local_88.data._M_elems[9] = result.m_backend.data._M_elems[9];
  local_88.data._M_elems[10] = result.m_backend.data._M_elems[10];
  local_88.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
  local_88.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
  local_88.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
  local_88.exp = result.m_backend.exp;
  local_88.neg = result.m_backend.neg;
  local_88.fpclass = result.m_backend.fpclass;
  local_88.prec_elem = result.m_backend.prec_elem;
  iVar21 = makeLvec(this,num,p_col);
  pnVar2 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar23 = (this->l).idx;
  lVar26 = (long)iVar21;
  piVar28 = &pnVar2[lVar26 + 1].m_backend.prec_elem;
  lVar27 = lVar26 << 0x20;
  lVar25 = 0;
  for (lVar29 = -4; iVar21 = *(int *)((long)p_idx + lVar29 + (long)num * 4), iVar21 != p_col;
      lVar29 = lVar29 + -4) {
    piVar23[lVar26 + lVar25] = iVar21;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems._56_5_ = 0;
    result.m_backend.data._M_elems[0xf]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result.m_backend,&local_88,&p_work[iVar21].m_backend);
    *(undefined8 *)(piVar28 + -0x1b) = result.m_backend.data._M_elems._48_8_;
    *(ulong *)(piVar28 + -0x19) =
         CONCAT35(result.m_backend.data._M_elems[0xf]._1_3_,result.m_backend.data._M_elems._56_5_);
    *(undefined8 *)(piVar28 + -0x1f) = result.m_backend.data._M_elems._32_8_;
    *(undefined8 *)(piVar28 + -0x1d) = result.m_backend.data._M_elems._40_8_;
    *(undefined8 *)(piVar28 + -0x23) = result.m_backend.data._M_elems._16_8_;
    *(undefined8 *)(piVar28 + -0x21) = result.m_backend.data._M_elems._24_8_;
    *(undefined8 *)(piVar28 + -0x27) = result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)(piVar28 + -0x25) = result.m_backend.data._M_elems._8_8_;
    piVar28[-0x17] = result.m_backend.exp;
    *(bool *)(piVar28 + -0x16) = result.m_backend.neg;
    *(undefined8 *)(piVar28 + -0x15) = result.m_backend._72_8_;
    piVar28 = piVar28 + 0x14;
    lVar27 = lVar27 + 0x100000000;
    lVar25 = lVar25 + 1;
  }
  lVar24 = lVar27 >> 0x20;
  *(int *)((long)piVar23 + (lVar27 >> 0x1e)) = p_col;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x10;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems._56_5_ = 0;
  result.m_backend.data._M_elems[0xf]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  local_130 = 1;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
            (&result.m_backend,&local_130,&local_88);
  puVar1 = (uint *)((long)pnVar2[lVar24].m_backend.data._M_elems + 0x30);
  *(undefined8 *)puVar1 = result.m_backend.data._M_elems._48_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(result.m_backend.data._M_elems[0xf]._1_3_,result.m_backend.data._M_elems._56_5_);
  puVar1 = (uint *)((long)pnVar2[lVar24].m_backend.data._M_elems + 0x20);
  *(undefined8 *)puVar1 = result.m_backend.data._M_elems._32_8_;
  *(undefined8 *)(puVar1 + 2) = result.m_backend.data._M_elems._40_8_;
  puVar1 = (uint *)((long)pnVar2[lVar24].m_backend.data._M_elems + 0x10);
  *(undefined8 *)puVar1 = result.m_backend.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = result.m_backend.data._M_elems._24_8_;
  *(undefined8 *)pnVar2[lVar24].m_backend.data._M_elems = result.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((long)pnVar2[lVar24].m_backend.data._M_elems + 8) =
       result.m_backend.data._M_elems._8_8_;
  pnVar2[lVar24].m_backend.exp = result.m_backend.exp;
  pnVar2[lVar24].m_backend.neg = result.m_backend.neg;
  pnVar2[lVar24].m_backend.fpclass = result.m_backend.fpclass;
  pnVar2[lVar24].m_backend.prec_elem = result.m_backend.prec_elem;
  piVar23 = (int *)((long)piVar23 + (lVar26 * 4 - lVar29));
  for (uVar22 = (num - (int)lVar25) - 2; -1 < (int)uVar22; uVar22 = uVar22 - 1) {
    iVar21 = p_idx[uVar22];
    *piVar23 = iVar21;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems._56_5_ = 0;
    result.m_backend.data._M_elems[0xf]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result.m_backend,&local_88,&p_work[iVar21].m_backend);
    bVar17 = result.m_backend.neg;
    iVar21 = result.m_backend.exp;
    uVar15 = result.m_backend.data._M_elems._48_8_;
    uVar13 = result.m_backend.data._M_elems._40_8_;
    uVar11 = result.m_backend.data._M_elems._32_8_;
    uVar9 = result.m_backend.data._M_elems._24_8_;
    uVar7 = result.m_backend.data._M_elems._16_8_;
    uVar5 = result.m_backend.data._M_elems._8_8_;
    uVar4 = result.m_backend.data._M_elems._0_8_;
    uVar3 = CONCAT35(result.m_backend.data._M_elems[0xf]._1_3_,result.m_backend.data._M_elems._56_5_
                    );
    fVar18 = result.m_backend.fpclass;
    iVar19 = result.m_backend.prec_elem;
    *(undefined8 *)(piVar28 + -7) = result.m_backend.data._M_elems._48_8_;
    *(undefined8 *)(piVar28 + -5) = uVar3;
    *(undefined8 *)(piVar28 + -0xb) = result.m_backend.data._M_elems._32_8_;
    *(undefined8 *)(piVar28 + -9) = result.m_backend.data._M_elems._40_8_;
    *(undefined8 *)(piVar28 + -0xf) = result.m_backend.data._M_elems._16_8_;
    *(undefined8 *)(piVar28 + -0xd) = result.m_backend.data._M_elems._24_8_;
    *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)(piVar28 + -0x13))->data)._M_elems =
         result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)(piVar28 + -0x11) = result.m_backend.data._M_elems._8_8_;
    piVar28[-3] = result.m_backend.exp;
    *(bool *)(piVar28 + -2) = result.m_backend.neg;
    piVar28[-1] = result.m_backend.fpclass;
    *piVar28 = result.m_backend.prec_elem;
    local_d8 = (multiprecision  [8])result.m_backend.data._M_elems._0_8_;
    auStack_d0[0] = result.m_backend.data._M_elems[2];
    auStack_d0[1] = result.m_backend.data._M_elems[3];
    local_c8[0] = result.m_backend.data._M_elems[4];
    local_c8[1] = result.m_backend.data._M_elems[5];
    auStack_c0[0] = result.m_backend.data._M_elems[6];
    auStack_c0[1] = result.m_backend.data._M_elems[7];
    local_b8[0] = result.m_backend.data._M_elems[8];
    local_b8[1] = result.m_backend.data._M_elems[9];
    auStack_b0[0] = result.m_backend.data._M_elems[10];
    auStack_b0[1] = result.m_backend.data._M_elems[0xb];
    local_a8[0] = result.m_backend.data._M_elems[0xc];
    local_a8[1] = result.m_backend.data._M_elems[0xd];
    local_98 = result.m_backend.exp;
    local_94 = result.m_backend.neg;
    local_90 = result.m_backend.fpclass;
    local_8c = result.m_backend.prec_elem;
    uStack_a0 = uVar3;
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((type *)&result.m_backend,local_d8,arg);
    tVar20 = boost::multiprecision::operator>
                       ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result.m_backend,&this->maxabs);
    uVar16 = result.m_backend.data._M_elems._48_8_;
    uVar14 = result.m_backend.data._M_elems._40_8_;
    uVar12 = result.m_backend.data._M_elems._32_8_;
    uVar10 = result.m_backend.data._M_elems._24_8_;
    uVar8 = result.m_backend.data._M_elems._16_8_;
    uVar6 = result.m_backend.data._M_elems._8_8_;
    if (tVar20) {
      local_128 = (multiprecision  [8])uVar4;
      result.m_backend.data._M_elems[2] = (uint)uVar5;
      result.m_backend.data._M_elems[3] = SUB84(uVar5,4);
      auStack_120[0] = result.m_backend.data._M_elems[2];
      auStack_120[1] = result.m_backend.data._M_elems[3];
      result.m_backend.data._M_elems[4] = (uint)uVar7;
      result.m_backend.data._M_elems[5] = SUB84(uVar7,4);
      local_118[0] = result.m_backend.data._M_elems[4];
      local_118[1] = result.m_backend.data._M_elems[5];
      result.m_backend.data._M_elems[6] = (uint)uVar9;
      result.m_backend.data._M_elems[7] = SUB84(uVar9,4);
      auStack_110[0] = result.m_backend.data._M_elems[6];
      auStack_110[1] = result.m_backend.data._M_elems[7];
      result.m_backend.data._M_elems[8] = (uint)uVar11;
      result.m_backend.data._M_elems[9] = SUB84(uVar11,4);
      local_108[0] = result.m_backend.data._M_elems[8];
      local_108[1] = result.m_backend.data._M_elems[9];
      result.m_backend.data._M_elems[10] = (uint)uVar13;
      result.m_backend.data._M_elems[0xb] = SUB84(uVar13,4);
      auStack_100[0] = result.m_backend.data._M_elems[10];
      auStack_100[1] = result.m_backend.data._M_elems[0xb];
      result.m_backend.data._M_elems[0xc] = (uint)uVar15;
      result.m_backend.data._M_elems[0xd] = SUB84(uVar15,4);
      local_f8[0] = result.m_backend.data._M_elems[0xc];
      local_f8[1] = result.m_backend.data._M_elems[0xd];
      local_e8 = iVar21;
      local_e4 = bVar17;
      local_e0 = fVar18;
      local_dc = iVar19;
      result.m_backend.data._M_elems._8_8_ = uVar6;
      result.m_backend.data._M_elems._16_8_ = uVar8;
      result.m_backend.data._M_elems._24_8_ = uVar10;
      result.m_backend.data._M_elems._32_8_ = uVar12;
      result.m_backend.data._M_elems._40_8_ = uVar14;
      result.m_backend.data._M_elems._48_8_ = uVar16;
      uStack_f0 = uVar3;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result,local_128,arg_00);
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 0xc) =
           result.m_backend.data._M_elems._48_8_;
      *(ulong *)((this->maxabs).m_backend.data._M_elems + 0xe) =
           CONCAT35(result.m_backend.data._M_elems[0xf]._1_3_,result.m_backend.data._M_elems._56_5_)
      ;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 8) =
           result.m_backend.data._M_elems._32_8_;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 10) =
           result.m_backend.data._M_elems._40_8_;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 6) =
           result.m_backend.data._M_elems._24_8_;
      *(undefined8 *)(this->maxabs).m_backend.data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (this->maxabs).m_backend.exp = result.m_backend.exp;
      (this->maxabs).m_backend.neg = result.m_backend.neg;
      (this->maxabs).m_backend.fpclass = result.m_backend.fpclass;
      (this->maxabs).m_backend.prec_elem = result.m_backend.prec_elem;
    }
    piVar23 = piVar23 + 1;
    piVar28 = piVar28 + 0x14;
  }
  this->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::updateNoClear(
   int p_col,
   const R* p_work,
   const int* p_idx,
   int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   ll = makeLvec(num, p_col);
   //ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}